

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O3

char * decodeText(char *src)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  size_t __size;
  
  __size = 1;
  pcVar2 = src;
  do {
    if (*pcVar2 == '\\') {
      if ((int)pcVar2[1] - 0x30U < 10) {
        pcVar2 = pcVar2 + 3;
      }
      else {
        pcVar2 = pcVar2 + 1;
      }
    }
    else if (*pcVar2 == '\0') break;
    pcVar2 = pcVar2 + 1;
    __size = __size + 1;
  } while( true );
  pcVar1 = (char *)malloc(__size);
  pcVar2 = pcVar1;
  do {
    cVar4 = *src;
    if (cVar4 == '\\') {
      pcVar3 = src + 1;
      cVar4 = src[1];
      if (cVar4 == '\\') goto LAB_001c4fbe;
      if (cVar4 == 'r') {
        cVar4 = '\r';
        goto LAB_001c4fbe;
      }
      if (cVar4 == 'n') {
        cVar4 = '\n';
        goto LAB_001c4fbe;
      }
      if ((int)cVar4 - 0x30U < 10) {
        pcVar3 = src + 3;
        cVar4 = src[2] * '\b' + cVar4 * '@' + src[3] + 'P';
        goto LAB_001c4fbe;
      }
    }
    else {
      pcVar3 = src;
      if (cVar4 == '\0') {
        *pcVar2 = '\0';
        return pcVar1;
      }
LAB_001c4fbe:
      *pcVar2 = cVar4;
      pcVar2 = pcVar2 + 1;
    }
    src = pcVar3 + 1;
  } while( true );
}

Assistant:

static char *decodeText( const char *src ) {
  int len = 0;
  const char *s = src;
  for ( ; *s; s++, len++ ) {
    if ( *s == '\\' ) {
      if ( isdigit( s[1] ) ) {
        s+=3; 
      } else { 
        s+=1;
      }
    }
  }
  char *dst = (char*)malloc( len+1 ), *d = dst;
  for ( s = src; *s; s++ ) {
    char c = *s;
    if ( c == '\\' ) {
      if ( s[1] == '\\' ) { *d++ = c; s++; }
      else if ( s[1] == 'n' ) { *d++ = '\n'; s++; }
      else if ( s[1] == 'r' ) { *d++ = '\r'; s++; }
      else if ( isdigit( s[1] ) ) { *d++ = ((s[1]-'0')<<6) + ((s[2]-'0')<<3) + (s[3]-'0'); s+=3; }
      else s++; // error
    }
    else
      *d++ = c;
  }
  *d = 0;
  return dst;
}